

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O3

string * __thiscall
kratos::Sequence::to_string_abi_cxx11_(string *__return_storage_ptr__,Sequence *this)

{
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/tb.cc:41:17)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(kratos::Var_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/tb.cc:41:17)>
             ::_M_manager;
  to_string(__return_storage_ptr__,this,
            (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(kratos::Var_*)>
             *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Sequence::to_string() const {
    auto func = [](Var *v) { return v->handle_name(true); };
    return to_string(func);
}